

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

Aig_Man_t * Saig_ManWindowExtract(Aig_Man_t *p,Aig_Obj_t *pObj,int nDist)

{
  Vec_Ptr_t *vNodes_00;
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *vNodes;
  Aig_Man_t *pWnd;
  int nDist_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  Aig_ManFanoutStart(p);
  vNodes_00 = Saig_ManWindowOutline(p,pObj,nDist);
  pAVar1 = Saig_ManWindowExtractNodes(p,vNodes_00);
  Vec_PtrFree(vNodes_00);
  Aig_ManFanoutStop(p);
  return pAVar1;
}

Assistant:

Aig_Man_t * Saig_ManWindowExtract( Aig_Man_t * p, Aig_Obj_t * pObj, int nDist )
{
    Aig_Man_t * pWnd;
    Vec_Ptr_t * vNodes;
    Aig_ManFanoutStart( p );
    vNodes = Saig_ManWindowOutline( p, pObj, nDist );
    pWnd = Saig_ManWindowExtractNodes( p, vNodes );
    Vec_PtrFree( vNodes );
    Aig_ManFanoutStop( p );
    return pWnd;
}